

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O0

void __thiscall
Rml::FontEffectGlow::GenerateGlyphTexture
          (FontEffectGlow *this,byte *destination_data,Vector2i destination_dimensions,
          int destination_stride,FontGlyph *glyph)

{
  byte *source;
  uchar *puVar1;
  uchar *source_00;
  Vector2i local_b8;
  Vector2i local_b0;
  Vector2i local_a8;
  Vector2i local_a0;
  Vector2i local_98;
  Vector2i local_90;
  Vector2i local_88;
  Vector2i local_80;
  Vector2i local_78;
  undefined1 local_60 [8];
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> blur_x_output;
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> outline_output;
  int buf_size;
  int buf_stride;
  Vector2i buf_dimensions;
  FontGlyph *glyph_local;
  int destination_stride_local;
  byte *destination_data_local;
  FontEffectGlow *this_local;
  Vector2i destination_dimensions_local;
  
  buf_size = destination_dimensions.x;
  buf_stride = destination_dimensions.y;
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::DynamicArray
            ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)
             &blur_x_output.p,(long)(buf_size * buf_stride));
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::DynamicArray
            ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)local_60,
             (long)(buf_size * buf_stride));
  puVar1 = DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::data
                     ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)
                      &blur_x_output.p);
  source = glyph->bitmap_data;
  local_80 = glyph->bitmap_dimensions;
  local_78 = destination_dimensions;
  Vector2<int>::Vector2(&local_88,this->combined_width);
  ConvolutionFilter::Run
            (&this->filter_outline,puVar1,local_78,buf_size,A8,source,local_80,local_88,
             glyph->color_format);
  puVar1 = DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::data
                     ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)
                      local_60);
  local_90 = destination_dimensions;
  source_00 = DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::data
                        ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)
                         &blur_x_output.p);
  local_98 = destination_dimensions;
  Vector2<int>::Vector2(&local_a0,0);
  ConvolutionFilter::Run
            (&this->filter_blur_x,puVar1,local_90,buf_size,A8,source_00,local_98,local_a0,A8);
  local_a8 = destination_dimensions;
  puVar1 = DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::data
                     ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)
                      local_60);
  local_b0 = destination_dimensions;
  Vector2<int>::Vector2(&local_b8,0);
  ConvolutionFilter::Run
            (&this->filter_blur_y,destination_data,local_a8,destination_stride,RGBA8,puVar1,local_b0
             ,local_b8,A8);
  FontEffect::FillColorValuesFromAlpha(destination_data,destination_dimensions,destination_stride);
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::~DynamicArray
            ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)local_60);
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::~DynamicArray
            ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)
             &blur_x_output.p);
  return;
}

Assistant:

void FontEffectGlow::GenerateGlyphTexture(byte* destination_data, const Vector2i destination_dimensions, int destination_stride,
	const FontGlyph& glyph) const
{
	const Vector2i buf_dimensions = destination_dimensions;
	const int buf_stride = buf_dimensions.x;
	const int buf_size = buf_dimensions.x * buf_dimensions.y;

	DynamicArray<byte, GlobalStackAllocator<byte>> outline_output(buf_size);
	DynamicArray<byte, GlobalStackAllocator<byte>> blur_x_output(buf_size);

	filter_outline.Run(outline_output.data(), buf_dimensions, buf_stride, ColorFormat::A8, glyph.bitmap_data, glyph.bitmap_dimensions,
		Vector2i(combined_width), glyph.color_format);

	filter_blur_x.Run(blur_x_output.data(), buf_dimensions, buf_stride, ColorFormat::A8, outline_output.data(), buf_dimensions, Vector2i(0),
		ColorFormat::A8);

	filter_blur_y.Run(destination_data, destination_dimensions, destination_stride, ColorFormat::RGBA8, blur_x_output.data(), buf_dimensions,
		Vector2i(0), ColorFormat::A8);

	FillColorValuesFromAlpha(destination_data, destination_dimensions, destination_stride);
}